

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em_full_vars.c
# Opt level: O0

float Expectation(float *Tau,float *x,float *c,float **mean,float **hafinvvar,float *corprod,int K,
                 int Ndim)

{
  float fVar1;
  double dVar2;
  int local_4c;
  int i;
  float invsum;
  float sum;
  float max;
  float Probability;
  float *corprod_local;
  float **hafinvvar_local;
  float **mean_local;
  float *c_local;
  float *x_local;
  float *Tau_local;
  
  invsum = gauss(x,*mean,*hafinvvar,*corprod,Ndim);
  *Tau = invsum;
  for (local_4c = 1; local_4c < K; local_4c = local_4c + 1) {
    fVar1 = gauss(x,mean[local_4c],hafinvvar[local_4c],corprod[local_4c],Ndim);
    Tau[local_4c] = fVar1;
    if (invsum < Tau[local_4c]) {
      invsum = Tau[local_4c];
    }
  }
  i = 0;
  for (local_4c = 0; local_4c < K; local_4c = local_4c + 1) {
    if (Tau[local_4c] <= invsum - 22.0) {
      Tau[local_4c] = 0.0;
    }
    else {
      dVar2 = exp((double)((Tau[local_4c] - invsum) + 10.0));
      Tau[local_4c] = (float)dVar2;
      i = (int)(Tau[local_4c] + (float)i);
    }
  }
  for (local_4c = 0; local_4c < K; local_4c = local_4c + 1) {
    Tau[local_4c] = (1.0 / (float)i) * Tau[local_4c];
  }
  dVar2 = log((double)(float)i);
  return (float)(((double)invsum + dVar2) - 10.0);
}

Assistant:

float Expectation(float *Tau,	/* Mode probablity of observation vector x */
		  float *x,	/* Observation vector x */
		  float *c,	/* Mixing proportions of modes */
		  float **mean,	/* Means of the modes */
		  float **hafinvvar,	/* 1.0/(2.0*variance) of the modes */
		  float *corprod,	/* Precomputed 1/sqrt(2PI**Ndim * mod(variance)) */
		  int K,	/* Number of modes */
		  int Ndim	/* Dimensionality of observation/distribution */
    )
{
	float Probability, max, sum, invsum;

	int i;


	Tau[0] = max = gauss(x, mean[0], hafinvvar[0], corprod[0], Ndim);
	for (i = 1; i < K; ++i) {
		/*
		 * Note: prior c[i] has already been factored into corprod
		 */
		Tau[i] = gauss(x, mean[i], hafinvvar[i], corprod[i], Ndim);
		if (Tau[i] > max)
			max = Tau[i];
	}

	/* convert Tau from log to linear */
	sum = 0.0;
	for (i = 0; i < K; ++i) {
		if (Tau[i] > max - 22) {	/* only consider probs within 10^10 of max */
			Tau[i] = exp(Tau[i] - max + 10);
			sum += Tau[i];
		} else
			Tau[i] = 0;
	}
	invsum = 1.0 / sum;
	for (i = 0; i < K; ++i)
		Tau[i] *= invsum;

	Probability = max + log(sum) - 10;
	return (Probability);
}